

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

RegexPattern *
Js::RegexHelper::CompileDynamic
          (ScriptContext *scriptContext,char16 *psz,CharCount csz,char16 *pszOpts,CharCount cszOpts,
          bool isLiteralSource)

{
  code *pcVar1;
  RegexFlags flags_00;
  bool bVar2;
  undefined4 *puVar3;
  RegexPattern *pRVar4;
  RegexPatternMruMap *this;
  undefined1 local_80 [8];
  RegexKey lookupKey;
  InternalString source;
  RegexKey finalKey;
  RegexPattern *pattern;
  RegexFlags local_31 [8];
  RegexFlags flags;
  
  if ((psz == (char16 *)0x0) || (psz[csz] != L'\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x51,"(psz != 0 && psz[csz] == 0)","psz != 0 && psz[csz] == 0");
    if (!bVar2) goto LAB_00d3a854;
    *puVar3 = 0;
  }
  if (cszOpts == 0 || pszOpts != (char16 *)0x0) {
    if (pszOpts != (char16 *)0x0) {
      if (pszOpts[cszOpts] != L'\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x53,"(pszOpts == 0 || pszOpts[cszOpts] == 0)",
                                    "pszOpts == 0 || pszOpts[cszOpts] == 0");
        if (!bVar2) goto LAB_00d3a854;
        *puVar3 = 0;
      }
      local_31[0] = NoRegexFlags;
      bVar2 = GetFlags(scriptContext,pszOpts,cszOpts,local_31);
      if (!bVar2) {
        PrimCompileDynamic(scriptContext,psz,csz,pszOpts,cszOpts,isLiteralSource);
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x5d,"(false)","false");
        if (!bVar2) goto LAB_00d3a854;
        *puVar3 = 0;
      }
      goto LAB_00d3a76f;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x52,"(pszOpts != 0 || cszOpts == 0)",
                                "pszOpts != 0 || cszOpts == 0");
    if (!bVar2) {
LAB_00d3a854:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_31[0] = NoRegexFlags;
LAB_00d3a76f:
  flags_00 = local_31[0];
  if (isLiteralSource) {
    pRVar4 = PrimCompileDynamic(scriptContext,psz,csz,pszOpts,cszOpts,true);
    return pRVar4;
  }
  UnifiedRegex::RegexKey::RegexKey((RegexKey *)local_80,psz,csz,local_31[0]);
  finalKey.length = 0;
  finalKey.flags = NoRegexFlags;
  finalKey._13_3_ = 0;
  this = ScriptContext::GetDynamicRegexMap(scriptContext);
  bVar2 = JsUtil::
          MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
          ::TryGetValue(this,(RegexKey *)local_80,(RegexPattern **)&finalKey.length);
  if (!bVar2) {
    finalKey._8_8_ = PrimCompileDynamic(scriptContext,psz,csz,pszOpts,cszOpts,false);
    UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&lookupKey.length);
    UnifiedRegex::RegexKey::RegexKey
              ((RegexKey *)&source.m_content,
               (char16 *)((ulong)((uint)lookupKey.flags * 2) + source._0_8_),lookupKey.length,
               flags_00);
    JsUtil::
    MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
    ::Add(this,(RegexKey *)&source.m_content,(RegexPattern **)&finalKey.length);
  }
  return (RegexPattern *)finalKey._8_8_;
}

Assistant:

UnifiedRegex::RegexPattern* RegexHelper::CompileDynamic(ScriptContext *scriptContext, const char16* psz, CharCount csz, const char16* pszOpts, CharCount cszOpts, bool isLiteralSource)
    {
        Assert(psz != 0 && psz[csz] == 0);
        Assert(pszOpts != 0 || cszOpts == 0);
        Assert(pszOpts == 0 || pszOpts[cszOpts] == 0);

        UnifiedRegex::RegexFlags flags = UnifiedRegex::NoRegexFlags;

        if (pszOpts != NULL)
        {
            if (!GetFlags(scriptContext, pszOpts, cszOpts, flags))
            {
                // Compile in order to throw appropriate error for ill-formed flags
                PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);
                Assert(false);
            }
        }

        if(isLiteralSource)
        {
            // The source is from a literal regex, so we're cloning a literal regex. Don't use the dynamic regex MRU map since
            // these literal regex patterns' lifetimes are tied with the function body.
            return PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);
        }

        UnifiedRegex::RegexKey lookupKey(psz, csz, flags);
        UnifiedRegex::RegexPattern* pattern = nullptr;
        RegexPatternMruMap* dynamicRegexMap = scriptContext->GetDynamicRegexMap();
        if (!dynamicRegexMap->TryGetValue(lookupKey, &pattern))
        {
            pattern = PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);

            // WARNING: Must calculate key again so that dictionary has copy of source associated with the pattern
            const auto source = pattern->GetSource();
            UnifiedRegex::RegexKey finalKey(source.GetBuffer(), source.GetLength(), flags);
            dynamicRegexMap->Add(finalKey, pattern);
        }
        return pattern;
    }